

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<2,_8,_9>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  float *pfVar1;
  Vector<float,_3> *pVVar2;
  bool bVar3;
  undefined4 *puVar4;
  long lVar5;
  Vector<float,_3> *pVVar6;
  float *pfVar7;
  long lVar8;
  int col;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar13;
  float fVar14;
  undefined4 uVar15;
  Mat3x2 m;
  Mat3 m_1;
  Matrix<float,_2,_3> local_98;
  float afStack_80 [2];
  undefined8 local_78;
  float local_70;
  Matrix<float,_3,_3> local_68;
  int aiStack_40 [6];
  float local_28;
  undefined8 uStack_24;
  float fStack_1c;
  float local_18;
  float local_14;
  long lVar12;
  
  pfVar1 = local_98.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar7 = (float *)&local_98;
    bVar13 = true;
    do {
      bVar3 = bVar13;
      lVar9 = 0;
      auVar10 = _DAT_00ada920;
      do {
        bVar13 = SUB164(auVar10 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar10 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar13) {
          fVar14 = 1.0;
          if (lVar5 != lVar9) {
            fVar14 = 0.0;
          }
          pfVar7[lVar9 * 2] = fVar14;
        }
        if (bVar13) {
          fVar14 = 1.0;
          if (lVar5 + -1 != lVar9) {
            fVar14 = 0.0;
          }
          pfVar7[lVar9 * 2 + 2] = fVar14;
        }
        lVar9 = lVar9 + 2;
        lVar8 = auVar10._8_8_;
        auVar10._0_8_ = auVar10._0_8_ + 2;
        auVar10._8_8_ = lVar8 + 2;
      } while (lVar9 != 4);
      lVar5 = 1;
      pfVar7 = pfVar1;
      bVar13 = false;
    } while (bVar3);
    local_98.m_data.m_data[0].m_data = *(float (*) [2])evalCtx->in[0].m_data;
    local_98.m_data.m_data[1].m_data = *(float (*) [2])evalCtx->in[1].m_data;
    local_98.m_data.m_data[2].m_data = *(float (*) [2])evalCtx->in[2].m_data;
  }
  else {
    local_98.m_data.m_data[0].m_data[0] = 0.0;
    local_98.m_data.m_data[0].m_data[1] = 0.0;
    local_98.m_data.m_data[1].m_data[0] = 0.0;
    local_98.m_data.m_data[1].m_data[1] = 0.0;
    local_98.m_data.m_data[2].m_data[0] = 0.0;
    local_98.m_data.m_data[2].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar7 = (float *)&local_98;
    bVar13 = true;
    do {
      bVar3 = bVar13;
      lVar9 = 0;
      do {
        pfVar7[lVar9 * 2] = *(float *)((long)&s_constInMat3x2 + lVar5 + lVar9 * 4);
        lVar9 = lVar9 + 1;
      } while (lVar9 != 3);
      lVar5 = 0xc;
      pfVar7 = pfVar1;
      bVar13 = false;
    } while (bVar3);
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    pfVar1 = (float *)&local_68;
    lVar5 = 0;
    lVar9 = 0;
    do {
      lVar8 = 0;
      auVar11 = _DAT_00ada920;
      do {
        bVar13 = SUB164(auVar11 ^ _DAT_00ad8f80,4) == -0x80000000 &&
                 SUB164(auVar11 ^ _DAT_00ad8f80,0) < -0x7ffffffd;
        if (bVar13) {
          uVar15 = 0x3f800000;
          if (lVar5 != lVar8) {
            uVar15 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar8) = uVar15;
        }
        if (bVar13) {
          uVar15 = 0x3f800000;
          if (lVar5 + -0xc != lVar8) {
            uVar15 = 0;
          }
          *(undefined4 *)((long)pfVar1 + lVar8 + 0xc) = uVar15;
        }
        lVar12 = auVar11._8_8_;
        auVar11._0_8_ = auVar11._0_8_ + 2;
        auVar11._8_8_ = lVar12 + 2;
        lVar8 = lVar8 + 0x18;
      } while (lVar8 != 0x30);
      lVar9 = lVar9 + 1;
      lVar5 = lVar5 + 0xc;
      pfVar1 = pfVar1 + 1;
    } while (lVar9 != 3);
    local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
    local_68.m_data.m_data[1].m_data._4_8_ = *(undefined8 *)(evalCtx->in[1].m_data + 1);
    local_68.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
    local_68.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
    local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  }
  else {
    pVVar2 = (Vector<float,_3> *)&local_68;
    local_68.m_data.m_data[1].m_data[1] = 0.0;
    local_68.m_data.m_data[1].m_data[2] = 0.0;
    local_68.m_data.m_data[2].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[0] = 0.0;
    local_68.m_data.m_data[0].m_data[1] = 0.0;
    local_68.m_data.m_data[0].m_data[2] = 0.0;
    local_68.m_data.m_data[1].m_data[0] = 0.0;
    local_68.m_data.m_data[2].m_data[2] = 0.0;
    puVar4 = &DAT_00ae3d34;
    lVar5 = 0;
    do {
      lVar9 = 0;
      pVVar6 = pVVar2;
      do {
        ((Vector<tcu::Vector<float,_3>,_3> *)pVVar6->m_data)->m_data[0].m_data[0] =
             (float)puVar4[lVar9];
        lVar9 = lVar9 + 1;
        pVVar6 = pVVar6 + 1;
      } while (lVar9 != 3);
      lVar5 = lVar5 + 1;
      pVVar2 = (Vector<float,_3> *)(pVVar2->m_data + 1);
      puVar4 = puVar4 + 3;
    } while (lVar5 != 3);
  }
  tcu::operator*(&local_98,&local_68);
  local_78 = CONCAT44(fStack_1c + (float)((ulong)uStack_24 >> 0x20),local_28 + (float)uStack_24);
  local_70 = local_18 + local_14;
  aiStack_40[2] = 0;
  aiStack_40[3] = 1;
  aiStack_40[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_40[lVar5]] = afStack_80[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 * in1);
	}